

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

int Fxch_ManComputeLevelDiv(Fxch_Man_t *pFxchMan,Vec_Int_t *vCubeFree)

{
  Vec_Int_t *p;
  int iVar1;
  int local_24;
  int Level;
  int Lit;
  int i;
  Vec_Int_t *vCubeFree_local;
  Fxch_Man_t *pFxchMan_local;
  
  local_24 = 0;
  for (Level = 0; iVar1 = Vec_IntSize(vCubeFree), Level < iVar1; Level = Level + 1) {
    iVar1 = Vec_IntEntry(vCubeFree,Level);
    p = pFxchMan->vLevels;
    iVar1 = Abc_Lit2Var(iVar1);
    iVar1 = Abc_Lit2Var(iVar1);
    iVar1 = Vec_IntEntry(p,iVar1);
    local_24 = Abc_MaxInt(local_24,iVar1);
  }
  iVar1 = Abc_MinInt(local_24,800);
  return iVar1;
}

Assistant:

int Fxch_ManComputeLevelDiv( Fxch_Man_t* pFxchMan,
                             Vec_Int_t* vCubeFree )
{
    int i,
        Lit,
        Level = 0;

    Vec_IntForEachEntry( vCubeFree, Lit, i )
        Level = Abc_MaxInt( Level, Vec_IntEntry( pFxchMan->vLevels, Abc_Lit2Var( Abc_Lit2Var( Lit ) ) ) );

    return Abc_MinInt( Level, 800 );
}